

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Response<capnp::AnyPointer> * __thiscall
kj::_::NullableValue<capnp::Response<capnp::AnyPointer>>::
emplace<capnp::Response<capnp::AnyPointer>>
          (NullableValue<capnp::Response<capnp::AnyPointer>> *this,
          Response<capnp::AnyPointer> *params)

{
  SegmentReader *pSVar1;
  CapTableReader *pCVar2;
  undefined8 uVar3;
  ResponseHook *pRVar4;
  
  if (*this == (NullableValue<capnp::Response<capnp::AnyPointer>>)0x1) {
    *this = (NullableValue<capnp::Response<capnp::AnyPointer>>)0x0;
    Own<capnp::ResponseHook,_std::nullptr_t>::dispose
              ((Own<capnp::ResponseHook,_std::nullptr_t> *)(this + 0x28));
  }
  pSVar1 = (params->super_Reader).reader.segment;
  pCVar2 = (params->super_Reader).reader.capTable;
  uVar3 = *(undefined8 *)&(params->super_Reader).reader.nestingLimit;
  *(WirePointer **)(this + 0x18) = (params->super_Reader).reader.pointer;
  *(undefined8 *)(this + 0x20) = uVar3;
  *(SegmentReader **)(this + 8) = pSVar1;
  *(CapTableReader **)(this + 0x10) = pCVar2;
  pRVar4 = (params->hook).ptr;
  *(Disposer **)(this + 0x28) = (params->hook).disposer;
  *(ResponseHook **)(this + 0x30) = pRVar4;
  (params->hook).ptr = (ResponseHook *)0x0;
  *this = (NullableValue<capnp::Response<capnp::AnyPointer>>)0x1;
  return (Response<capnp::AnyPointer> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }